

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

TriangleLight * __thiscall
embree::SceneGraph::TriangleLight::transform(TriangleLight *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 *in_RDX;
  long in_RSI;
  TriangleLight *in_RDI;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  float *local_aa0;
  undefined1 *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  float *local_a30;
  undefined1 *local_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  float *local_9c0;
  undefined8 *local_9b0;
  float local_9a4;
  undefined8 *local_9a0;
  float local_994;
  undefined8 *local_990;
  float local_984;
  undefined8 *local_980;
  float local_974;
  undefined8 *local_970;
  float local_964;
  undefined8 *local_960;
  float local_954;
  undefined8 *local_950;
  float local_944;
  undefined8 *local_940;
  float local_934;
  undefined8 *local_930;
  float local_924;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 *local_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b0;
  undefined8 *local_7a0;
  undefined1 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined1 *local_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined1 *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 *local_650;
  undefined1 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined1 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d8;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_448;
  undefined8 *local_438;
  undefined8 *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 *local_3b8;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_9c0 = (float *)(in_RSI + 0x10);
  local_9b0 = &local_b28;
  local_984 = *local_9c0;
  local_980 = &local_9d8;
  local_368 = CONCAT44(local_984,local_984);
  uStack_360 = CONCAT44(local_984,local_984);
  local_994 = *(float *)(in_RSI + 0x14);
  local_990 = &local_9f8;
  local_348 = CONCAT44(local_994,local_994);
  uStack_340 = CONCAT44(local_994,local_994);
  local_888 = in_RDX + 2;
  local_9a4 = *(float *)(in_RSI + 0x18);
  local_9a0 = &local_a18;
  local_328 = CONCAT44(local_9a4,local_9a4);
  uStack_320 = CONCAT44(local_9a4,local_9a4);
  local_818 = in_RDX + 4;
  local_820 = in_RDX + 6;
  local_890 = &local_a08;
  local_7f8 = &local_838;
  uVar1 = *local_818;
  uVar2 = in_RDX[5];
  local_338._0_4_ = (float)uVar1;
  local_338._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_330._0_4_ = (float)uVar2;
  uStack_330._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_3f8 = local_9a4 * (float)local_338;
  fStack_3f4 = local_9a4 * local_338._4_4_;
  fStack_3f0 = local_9a4 * (float)uStack_330;
  fStack_3ec = local_9a4 * uStack_330._4_4_;
  local_68 = CONCAT44(fStack_3f4,local_3f8);
  uStack_60 = CONCAT44(fStack_3ec,fStack_3f0);
  uVar3 = *local_820;
  uVar4 = in_RDX[7];
  local_78._0_4_ = (float)uVar3;
  local_78._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_70._0_4_ = (float)uVar4;
  uStack_70._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_7e8 = local_3f8 + (float)local_78;
  fStack_7e4 = fStack_3f4 + local_78._4_4_;
  fStack_7e0 = fStack_3f0 + (float)uStack_70;
  fStack_7dc = fStack_3ec + uStack_70._4_4_;
  local_900 = &local_9e8;
  local_868 = &local_8a8;
  uVar5 = *local_888;
  uVar6 = in_RDX[3];
  local_358._0_4_ = (float)uVar5;
  local_358._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_350._0_4_ = (float)uVar6;
  uStack_350._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_3c8 = local_994 * (float)local_358;
  fStack_3c4 = local_994 * local_358._4_4_;
  fStack_3c0 = local_994 * (float)uStack_350;
  fStack_3bc = local_994 * uStack_350._4_4_;
  local_48 = CONCAT44(fStack_3c4,local_3c8);
  uStack_40 = CONCAT44(fStack_3bc,fStack_3c0);
  local_58 = (float)local_a08;
  fStack_54 = (float)((ulong)local_a08 >> 0x20);
  fStack_50 = (float)uStack_a00;
  fStack_4c = (float)((ulong)uStack_a00 >> 0x20);
  local_858 = local_3c8 + local_58;
  fStack_854 = fStack_3c4 + fStack_54;
  fStack_850 = fStack_3c0 + fStack_50;
  fStack_84c = fStack_3bc + fStack_4c;
  local_8d8 = &local_918;
  uVar7 = *in_RDX;
  uVar8 = in_RDX[1];
  local_378._0_4_ = (float)uVar7;
  local_378._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_370._0_4_ = (float)uVar8;
  uStack_370._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_398 = local_984 * (float)local_378;
  fStack_394 = local_984 * local_378._4_4_;
  fStack_390 = local_984 * (float)uStack_370;
  fStack_38c = local_984 * uStack_370._4_4_;
  local_28 = CONCAT44(fStack_394,local_398);
  uStack_20 = CONCAT44(fStack_38c,fStack_390);
  local_38 = (float)local_9e8;
  fStack_34 = (float)((ulong)local_9e8 >> 0x20);
  fStack_30 = (float)uStack_9e0;
  fStack_2c = (float)((ulong)uStack_9e0 >> 0x20);
  local_8c8 = local_398 + local_38;
  fStack_8c4 = fStack_394 + fStack_34;
  fStack_8c0 = fStack_390 + fStack_30;
  fStack_8bc = fStack_38c + fStack_2c;
  local_b28 = CONCAT44(fStack_8c4,local_8c8);
  uStack_b20 = CONCAT44(fStack_8bc,fStack_8c0);
  local_a30 = (float *)(in_RSI + 0x20);
  local_a20 = &stack0xfffffffffffff4c8;
  local_954 = *local_a30;
  local_950 = &local_a48;
  local_308 = CONCAT44(local_954,local_954);
  uStack_300 = CONCAT44(local_954,local_954);
  local_964 = *(float *)(in_RSI + 0x24);
  local_960 = &local_a68;
  local_2e8 = CONCAT44(local_964,local_964);
  uStack_2e0 = CONCAT44(local_964,local_964);
  local_738 = in_RDX + 2;
  local_974 = *(float *)(in_RSI + 0x28);
  local_970 = &local_a88;
  local_2c8 = CONCAT44(local_974,local_974);
  uStack_2c0 = CONCAT44(local_974,local_974);
  local_6c8 = in_RDX + 4;
  local_6d0 = in_RDX + 6;
  local_740 = &local_a78;
  local_6a8 = &local_6e8;
  uVar9 = *local_6c8;
  uVar10 = in_RDX[5];
  local_2d8._0_4_ = (float)uVar9;
  local_2d8._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_2d0._0_4_ = (float)uVar10;
  uStack_2d0._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_488 = local_974 * (float)local_2d8;
  fStack_484 = local_974 * local_2d8._4_4_;
  fStack_480 = local_974 * (float)uStack_2d0;
  fStack_47c = local_974 * uStack_2d0._4_4_;
  local_c8 = CONCAT44(fStack_484,local_488);
  uStack_c0 = CONCAT44(fStack_47c,fStack_480);
  uVar11 = *local_6d0;
  uVar12 = in_RDX[7];
  local_d8._0_4_ = (float)uVar11;
  local_d8._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_d0._0_4_ = (float)uVar12;
  uStack_d0._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_698 = local_488 + (float)local_d8;
  fStack_694 = fStack_484 + local_d8._4_4_;
  fStack_690 = fStack_480 + (float)uStack_d0;
  fStack_68c = fStack_47c + uStack_d0._4_4_;
  local_7b0 = &local_a58;
  local_718 = &local_758;
  uVar13 = *local_738;
  uVar14 = in_RDX[3];
  local_2f8._0_4_ = (float)uVar13;
  local_2f8._4_4_ = (float)((ulong)uVar13 >> 0x20);
  uStack_2f0._0_4_ = (float)uVar14;
  uStack_2f0._4_4_ = (float)((ulong)uVar14 >> 0x20);
  local_458 = local_964 * (float)local_2f8;
  fStack_454 = local_964 * local_2f8._4_4_;
  fStack_450 = local_964 * (float)uStack_2f0;
  fStack_44c = local_964 * uStack_2f0._4_4_;
  local_a8 = CONCAT44(fStack_454,local_458);
  uStack_a0 = CONCAT44(fStack_44c,fStack_450);
  local_b8 = (float)local_a78;
  fStack_b4 = (float)((ulong)local_a78 >> 0x20);
  fStack_b0 = (float)uStack_a70;
  fStack_ac = (float)((ulong)uStack_a70 >> 0x20);
  local_708 = local_458 + local_b8;
  fStack_704 = fStack_454 + fStack_b4;
  fStack_700 = fStack_450 + fStack_b0;
  fStack_6fc = fStack_44c + fStack_ac;
  local_788 = &local_7c8;
  uVar15 = *in_RDX;
  uVar16 = in_RDX[1];
  local_318._0_4_ = (float)uVar15;
  local_318._4_4_ = (float)((ulong)uVar15 >> 0x20);
  uStack_310._0_4_ = (float)uVar16;
  uStack_310._4_4_ = (float)((ulong)uVar16 >> 0x20);
  local_428 = local_954 * (float)local_318;
  fStack_424 = local_954 * local_318._4_4_;
  fStack_420 = local_954 * (float)uStack_310;
  fStack_41c = local_954 * uStack_310._4_4_;
  local_88 = CONCAT44(fStack_424,local_428);
  uStack_80 = CONCAT44(fStack_41c,fStack_420);
  local_98 = (float)local_a58;
  fStack_94 = (float)((ulong)local_a58 >> 0x20);
  fStack_90 = (float)uStack_a50;
  fStack_8c = (float)((ulong)uStack_a50 >> 0x20);
  local_778 = local_428 + local_98;
  fStack_774 = fStack_424 + fStack_94;
  fStack_770 = fStack_420 + fStack_90;
  fStack_76c = fStack_41c + fStack_8c;
  local_aa0 = (float *)(in_RSI + 0x30);
  local_a90 = &stack0xfffffffffffff4b8;
  local_924 = *local_aa0;
  local_920 = &local_ab8;
  local_2a8 = CONCAT44(local_924,local_924);
  uStack_2a0 = CONCAT44(local_924,local_924);
  local_934 = *(float *)(in_RSI + 0x34);
  local_930 = &local_ad8;
  local_288 = CONCAT44(local_934,local_934);
  uStack_280 = CONCAT44(local_934,local_934);
  local_5e8 = in_RDX + 2;
  local_944 = *(float *)(in_RSI + 0x38);
  local_940 = &local_af8;
  local_268 = CONCAT44(local_944,local_944);
  uStack_260 = CONCAT44(local_944,local_944);
  local_578 = in_RDX + 4;
  local_580 = in_RDX + 6;
  local_568 = &local_ae8;
  local_570 = &local_af8;
  local_520 = &local_598;
  uVar17 = *local_578;
  uVar18 = in_RDX[5];
  local_278._0_4_ = (float)uVar17;
  local_278._4_4_ = (float)((ulong)uVar17 >> 0x20);
  uStack_270._0_4_ = (float)uVar18;
  uStack_270._4_4_ = (float)((ulong)uVar18 >> 0x20);
  local_518 = local_944 * (float)local_278;
  fStack_514 = local_944 * local_278._4_4_;
  fStack_510 = local_944 * (float)uStack_270;
  fStack_50c = local_944 * uStack_270._4_4_;
  local_508 = &local_598;
  local_128 = CONCAT44(fStack_514,local_518);
  uStack_120 = CONCAT44(fStack_50c,fStack_510);
  local_550 = &local_ae8;
  local_558 = &local_598;
  uVar19 = *local_580;
  uVar20 = in_RDX[7];
  local_138._0_4_ = (float)uVar19;
  local_138._4_4_ = (float)((ulong)uVar19 >> 0x20);
  uStack_130._0_4_ = (float)uVar20;
  uStack_130._4_4_ = (float)((ulong)uVar20 >> 0x20);
  local_548 = local_518 + (float)local_138;
  fStack_544 = fStack_514 + local_138._4_4_;
  fStack_540 = fStack_510 + (float)uStack_130;
  fStack_53c = fStack_50c + uStack_130._4_4_;
  local_538 = &local_ae8;
  local_5d8 = &local_ac8;
  local_5e0 = &local_ad8;
  local_5f0 = &local_ae8;
  local_4f0 = &local_608;
  uVar21 = *local_5e8;
  uVar22 = in_RDX[3];
  local_298._0_4_ = (float)uVar21;
  local_298._4_4_ = (float)((ulong)uVar21 >> 0x20);
  uStack_290._0_4_ = (float)uVar22;
  uStack_290._4_4_ = (float)((ulong)uVar22 >> 0x20);
  local_4e8 = local_934 * (float)local_298;
  fStack_4e4 = local_934 * local_298._4_4_;
  fStack_4e0 = local_934 * (float)uStack_290;
  fStack_4dc = local_934 * uStack_290._4_4_;
  local_4d8 = &local_608;
  local_108 = CONCAT44(fStack_4e4,local_4e8);
  uStack_100 = CONCAT44(fStack_4dc,fStack_4e0);
  local_5c0 = &local_ac8;
  local_5c8 = &local_608;
  local_118 = (float)local_ae8;
  fStack_114 = (float)((ulong)local_ae8 >> 0x20);
  fStack_110 = (float)uStack_ae0;
  fStack_10c = (float)((ulong)uStack_ae0 >> 0x20);
  local_5b8 = local_4e8 + local_118;
  fStack_5b4 = fStack_4e4 + fStack_114;
  fStack_5b0 = fStack_4e0 + fStack_110;
  fStack_5ac = fStack_4dc + fStack_10c;
  local_5a0 = &local_ac8;
  local_648 = &stack0xfffffffffffff4b8;
  local_650 = &local_ab8;
  local_660 = &local_ac8;
  local_4c0 = &local_678;
  uVar23 = *in_RDX;
  uVar24 = in_RDX[1];
  local_2b8._0_4_ = (float)uVar23;
  local_2b8._4_4_ = (float)((ulong)uVar23 >> 0x20);
  uStack_2b0._0_4_ = (float)uVar24;
  uStack_2b0._4_4_ = (float)((ulong)uVar24 >> 0x20);
  local_4b8 = local_924 * (float)local_2b8;
  fStack_4b4 = local_924 * local_2b8._4_4_;
  fStack_4b0 = local_924 * (float)uStack_2b0;
  fStack_4ac = local_924 * uStack_2b0._4_4_;
  local_4a8 = &local_678;
  local_e8 = CONCAT44(fStack_4b4,local_4b8);
  uStack_e0 = CONCAT44(fStack_4ac,fStack_4b0);
  local_630 = &stack0xfffffffffffff4b8;
  local_638 = &local_678;
  local_f8 = (float)local_ac8;
  fStack_f4 = (float)((ulong)local_ac8 >> 0x20);
  fStack_f0 = (float)uStack_ac0;
  fStack_ec = (float)((ulong)uStack_ac0 >> 0x20);
  local_628 = local_4b8 + local_f8;
  fStack_624 = fStack_4b4 + fStack_f4;
  fStack_620 = fStack_4b0 + fStack_f0;
  fStack_61c = fStack_4ac + fStack_ec;
  local_610 = &stack0xfffffffffffff4b8;
  local_8f0 = local_980;
  local_8e8 = local_9b0;
  local_8e0 = local_900;
  local_8d0 = local_9b0;
  local_8b0 = local_9b0;
  local_880 = local_990;
  local_878 = local_900;
  local_870 = local_890;
  local_860 = local_900;
  local_840 = local_900;
  local_810 = local_9a0;
  local_808 = local_890;
  local_800 = local_820;
  local_7f0 = local_890;
  local_7d0 = local_890;
  local_7a0 = local_950;
  local_798 = local_a20;
  local_790 = local_7b0;
  local_780 = local_a20;
  local_760 = local_a20;
  local_730 = local_960;
  local_728 = local_7b0;
  local_720 = local_740;
  local_710 = local_7b0;
  local_6f0 = local_7b0;
  local_6c0 = local_970;
  local_6b8 = local_740;
  local_6b0 = local_6d0;
  local_6a0 = local_740;
  local_680 = local_740;
  local_640 = local_660;
  local_5d0 = local_5f0;
  local_560 = local_580;
  local_530 = local_578;
  local_528 = local_570;
  local_500 = local_5e8;
  local_4f8 = local_5e0;
  local_4c8 = local_650;
  local_4a0 = local_6c8;
  local_498 = local_970;
  local_490 = local_6a8;
  local_478 = local_6a8;
  local_470 = local_738;
  local_468 = local_960;
  local_460 = local_718;
  local_448 = local_718;
  local_438 = local_950;
  local_430 = local_788;
  local_418 = local_788;
  local_410 = local_818;
  local_408 = local_9a0;
  local_400 = local_7f8;
  local_3e8 = local_7f8;
  local_3e0 = local_888;
  local_3d8 = local_990;
  local_3d0 = local_868;
  local_3b8 = local_868;
  local_3a8 = local_980;
  local_3a0 = local_8d8;
  local_380 = local_8d8;
  local_378 = uVar7;
  uStack_370 = uVar8;
  local_358 = uVar5;
  uStack_350 = uVar6;
  local_338 = uVar1;
  uStack_330 = uVar2;
  local_318 = uVar15;
  uStack_310 = uVar16;
  local_2f8 = uVar13;
  uStack_2f0 = uVar14;
  local_2d8 = uVar9;
  uStack_2d0 = uVar10;
  local_2b8 = uVar23;
  uStack_2b0 = uVar24;
  local_298 = uVar21;
  uStack_290 = uVar22;
  local_278 = uVar17;
  uStack_270 = uVar18;
  local_258 = local_924;
  fStack_254 = local_924;
  fStack_250 = local_924;
  fStack_24c = local_924;
  local_23c = local_924;
  local_238 = local_934;
  fStack_234 = local_934;
  fStack_230 = local_934;
  fStack_22c = local_934;
  local_21c = local_934;
  local_218 = local_944;
  fStack_214 = local_944;
  fStack_210 = local_944;
  fStack_20c = local_944;
  local_208 = local_944;
  local_1f8 = local_954;
  fStack_1f4 = local_954;
  fStack_1f0 = local_954;
  fStack_1ec = local_954;
  local_1dc = local_954;
  local_1d8 = local_964;
  fStack_1d4 = local_964;
  fStack_1d0 = local_964;
  fStack_1cc = local_964;
  local_1bc = local_964;
  local_1b8 = local_974;
  fStack_1b4 = local_974;
  fStack_1b0 = local_974;
  fStack_1ac = local_974;
  local_19c = local_974;
  local_198 = local_984;
  fStack_194 = local_984;
  fStack_190 = local_984;
  fStack_18c = local_984;
  local_17c = local_984;
  local_178 = local_994;
  fStack_174 = local_994;
  fStack_170 = local_994;
  fStack_16c = local_994;
  local_15c = local_994;
  local_158 = local_9a4;
  fStack_154 = local_9a4;
  fStack_150 = local_9a4;
  fStack_14c = local_9a4;
  local_13c = local_9a4;
  local_138 = uVar19;
  uStack_130 = uVar20;
  local_d8 = uVar11;
  uStack_d0 = uVar12;
  local_78 = uVar3;
  uStack_70 = uVar4;
  local_af8 = local_268;
  uStack_af0 = uStack_260;
  local_ae8 = CONCAT44(fStack_544,local_548);
  uStack_ae0 = CONCAT44(fStack_53c,fStack_540);
  local_ad8 = local_288;
  uStack_ad0 = uStack_280;
  local_ac8 = CONCAT44(fStack_5b4,local_5b8);
  uStack_ac0 = CONCAT44(fStack_5ac,fStack_5b0);
  local_ab8 = local_2a8;
  uStack_ab0 = uStack_2a0;
  local_a88 = local_2c8;
  uStack_a80 = uStack_2c0;
  local_a78 = CONCAT44(fStack_694,local_698);
  uStack_a70 = CONCAT44(fStack_68c,fStack_690);
  local_a68 = local_2e8;
  uStack_a60 = uStack_2e0;
  local_a58 = CONCAT44(fStack_704,local_708);
  uStack_a50 = CONCAT44(fStack_6fc,fStack_700);
  local_a48 = local_308;
  uStack_a40 = uStack_300;
  local_a18 = local_328;
  uStack_a10 = uStack_320;
  local_a08 = CONCAT44(fStack_7e4,local_7e8);
  uStack_a00 = CONCAT44(fStack_7dc,fStack_7e0);
  local_9f8 = local_348;
  uStack_9f0 = uStack_340;
  local_9e8 = CONCAT44(fStack_854,local_858);
  uStack_9e0 = CONCAT44(fStack_84c,fStack_850);
  local_9d8 = local_368;
  uStack_9d0 = uStack_360;
  local_918 = local_28;
  uStack_910 = uStack_20;
  local_8a8 = local_48;
  uStack_8a0 = uStack_40;
  local_838 = local_68;
  uStack_830 = uStack_60;
  local_7c8 = local_88;
  uStack_7c0 = uStack_80;
  local_758 = local_a8;
  uStack_750 = uStack_a0;
  local_6e8 = local_c8;
  uStack_6e0 = uStack_c0;
  local_678 = local_e8;
  uStack_670 = uStack_e0;
  local_608 = local_108;
  uStack_600 = uStack_100;
  local_598 = local_128;
  uStack_590 = uStack_120;
  TriangleLight((TriangleLight *)CONCAT44(fStack_76c,fStack_770),
                (Vec3fa *)CONCAT44(fStack_774,local_778),(Vec3fa *)CONCAT44(fStack_61c,fStack_620),
                (Vec3fa *)CONCAT44(fStack_624,local_628),(Vec3fa *)in_RDI);
  return in_RDI;
}

Assistant:

TriangleLight transform(const AffineSpace3fa& space) const {
        return TriangleLight(xfmPoint(space,v0),xfmPoint(space,v1),xfmPoint(space,v2),L);
      }